

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

void move_mimicked_object(chunk *c,monster *mon,loc_conflict src,loc_conflict dest)

{
  _Bool _Var1;
  object *poVar2;
  loc_conflict lVar3;
  chunk *local_60;
  chunk *p_c;
  _Bool local_39;
  object *poStack_38;
  _Bool dummy;
  object *moved;
  object *mimicked;
  monster *mon_local;
  chunk *c_local;
  loc_conflict dest_local;
  loc_conflict src_local;
  
  moved = mon->mimicked_obj;
  mimicked = (object *)mon;
  mon_local = (monster *)c;
  c_local = (chunk *)dest;
  dest_local = src;
  poStack_38 = object_new();
  local_39 = true;
  if (moved != (object *)0x0) {
    object_copy(poStack_38,moved);
    poStack_38->oidx = 0;
    moved->mimicking_m_idx = 0;
    if (moved->known != (object *)0x0) {
      poVar2 = object_new();
      poStack_38->known = poVar2;
      object_copy(poStack_38->known,moved->known);
      poStack_38->known->oidx = 0;
      poVar2 = poStack_38->known;
      lVar3 = (loc_conflict)loc(0,0);
      poVar2->grid = lVar3;
    }
    _Var1 = floor_carry((chunk *)mon_local,(loc_conflict)c_local,poStack_38,&local_39);
    if (_Var1) {
      *(object **)(mimicked->flags + 4) = poStack_38;
    }
    else {
      poStack_38->mimicking_m_idx = 0;
      *(undefined8 *)(mimicked->flags + 4) = 0;
      _Var1 = flag_has_dbg((bitflag *)&mimicked->kind->to_a,0xc,0x1e,"mon->race->flags",
                           "RF_MIMIC_INV");
      if ((!_Var1) ||
         (_Var1 = monster_carry((chunk *)mon_local,(monster *)mimicked,poStack_38), !_Var1)) {
        if (mon_local == (monster *)cave) {
          local_60 = (chunk *)player->cave;
        }
        else {
          local_60 = (chunk *)0x0;
        }
        if (poStack_38->known != (object *)0x0) {
          object_delete(local_60,(chunk *)0x0,&poStack_38->known);
        }
        object_delete((chunk *)mon_local,local_60,&stack0xffffffffffffffc8);
      }
    }
    square_delete_object((chunk *)mon_local,dest_local,moved,true,false);
    return;
  }
  __assert_fail("mimicked",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-util.c"
                ,0x23d,
                "void move_mimicked_object(struct chunk *, struct monster *, struct loc, struct loc)"
               );
}

Assistant:

static void move_mimicked_object(struct chunk *c, struct monster *mon,
	struct loc src, struct loc dest)
{
	struct object *mimicked = mon->mimicked_obj;
	/*
	 * Move a copy so, if necessary, the original can remain as a
	 * placeholder for the known version of the object in the player's
	 * view of the cave.
	 */
	struct object *moved = object_new();
	bool dummy = true;

	assert(mimicked);
	object_copy(moved, mimicked);
	moved->oidx = 0;
	mimicked->mimicking_m_idx = 0;
	if (mimicked->known) {
		moved->known = object_new();
		object_copy(moved->known, mimicked->known);
		moved->known->oidx = 0;
		moved->known->grid = loc(0,0);
	}
	if (floor_carry(c, dest, moved, &dummy)) {
		mon->mimicked_obj = moved;
	} else {
		/* Could not move the object so cancel mimicry. */
		moved->mimicking_m_idx = 0;
		mon->mimicked_obj = NULL;
		/* Give object to monster if appropriate; otherwise, delete. */
		if (!rf_has(mon->race->flags, RF_MIMIC_INV) ||
			!monster_carry(c, mon, moved)) {
			struct chunk *p_c = (c == cave) ? player->cave : NULL;
			if (moved->known) {
				object_delete(p_c, NULL, &moved->known);
			}
			object_delete(c, p_c, &moved);
		}
	}
	square_delete_object(c, src, mimicked, true, false);
}